

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_record.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  bool bVar11;
  undefined8 in_XMM1_Qa;
  size_t i_1;
  size_t bytes_read;
  size_t bytes_to_read;
  audio_buffer_t output;
  int c;
  int j;
  int gain;
  int i;
  int R;
  int sample_count;
  audio_buffer_t input;
  ALLEGRO_AUDIO_RECORDER_EVENT *re;
  ALLEGRO_EVENT e;
  int n;
  _Bool is_recording;
  int prev;
  ALLEGRO_PATH *tmp_path;
  ALLEGRO_FILE *fp;
  ALLEGRO_DISPLAY *d;
  ALLEGRO_EVENT_QUEUE *q;
  ALLEGRO_AUDIO_STREAM *s;
  ALLEGRO_AUDIO_RECORDER *r;
  ulong local_110;
  ulong local_108;
  int local_d0;
  int local_cc;
  int local_b8;
  int local_b4;
  int local_98 [2];
  int local_74;
  int local_4c;
  int local_44;
  long local_40;
  long local_38;
  long local_30;
  undefined8 local_28;
  long local_20;
  long local_18;
  undefined4 local_4;
  
  local_4 = 0;
  local_38 = 0;
  local_40 = 0;
  local_44 = 0;
  bVar1 = false;
  local_4c = 0;
  uVar5 = al_install_system(0x85020700,atexit);
  if ((uVar5 & 1) == 0) {
    abort_example("Could not init Allegro.\n");
  }
  uVar5 = al_init_primitives_addon();
  if ((uVar5 & 1) == 0) {
    abort_example("Unable to initialize primitives addon");
  }
  uVar5 = al_install_keyboard();
  if ((uVar5 & 1) == 0) {
    abort_example("Unable to install keyboard");
  }
  uVar5 = al_install_audio();
  if ((uVar5 & 1) == 0) {
    abort_example("Unable to initialize audio addon");
  }
  uVar5 = al_init_acodec_addon();
  if ((uVar5 & 1) == 0) {
    abort_example("Unable to initialize acodec addon");
  }
  local_18 = al_create_audio_recorder(1000,0x500,0x5622,8,0x10);
  if (local_18 == 0) {
    abort_example("Unable to create audio recorder");
  }
  local_20 = al_create_audio_stream(4,0x1000,0x5622,8,0x10);
  if (local_20 == 0) {
    abort_example("Unable to create audio stream");
  }
  al_reserve_samples(0);
  al_set_audio_stream_playing(local_20,0);
  lVar9 = local_20;
  uVar6 = al_get_default_mixer();
  al_attach_audio_stream_to_mixer(lVar9,uVar6);
  local_28 = al_create_event_queue();
  al_set_new_display_option(0x11,1,2);
  al_set_new_display_option(0x12,8,2);
  local_30 = al_create_display(0x140,0x100);
  if (local_30 == 0) {
    abort_example("Error creating display\n");
  }
  al_set_window_title(local_30,"SPACE to record. P to playback.");
  uVar6 = local_28;
  uVar7 = al_get_audio_recorder_event_source(local_18);
  al_register_event_source(uVar6,uVar7);
  uVar6 = local_28;
  uVar7 = al_get_audio_stream_event_source(local_20);
  al_register_event_source(uVar6,uVar7);
  uVar6 = local_28;
  uVar7 = al_get_display_event_source(local_30);
  al_register_event_source(uVar6,uVar7);
  uVar6 = local_28;
  uVar7 = al_get_keyboard_event_source();
  al_register_event_source(uVar6,uVar7);
  al_start_audio_recorder(local_18);
  while( true ) {
    do {
      while( true ) {
        while (al_wait_for_event(local_28,local_98), local_98[0] == 0x203) {
          lVar8 = al_get_audio_recorder_event(local_98);
          lVar9 = *(long *)(lVar8 + 0x20);
          iVar4 = *(int *)(lVar8 + 0x28);
          iVar2 = iVar4 / 0x140;
          local_b8 = 0;
          for (local_b4 = 0; local_b4 < iVar4; local_b4 = local_b4 + 1) {
            iVar10 = *(byte *)(lVar9 + local_b4) - 0x80;
            if (iVar10 < 1) {
              iVar10 = -iVar10;
            }
            if (local_b8 < iVar10) {
              local_b8 = *(byte *)(lVar9 + local_b4) - 0x80;
              if (local_b8 < 1) {
                local_b8 = -local_b8;
              }
            }
          }
          uVar6 = al_map_rgb(0,0);
          al_clear_to_color(uVar6,in_XMM1_Qa);
          if (bVar1) {
            if ((local_38 != 0) && ((float)local_4c < 5167.9688)) {
              al_fwrite(local_38,lVar9,(long)iVar4);
              local_4c = local_4c + 1;
            }
            for (local_b4 = 0; local_b4 < 0x140; local_b4 = local_b4 + 1) {
              local_d0 = 0;
              for (local_cc = local_b4 * iVar2;
                  local_cc < local_b4 * iVar2 + iVar2 && local_cc < iVar4; local_cc = local_cc + 1)
              {
                local_d0 = (*(byte *)(lVar9 + local_cc) - 0x80) + local_d0;
              }
              uVar7 = 0x43000000;
              uVar6 = al_map_rgb(0xff,0xff);
              al_draw_line((float)(local_b4 + -1),
                           (((float)(local_44 + 0x80) / 255.0) * 256.0 + 128.0) - 128.0,
                           (float)local_b4,
                           (((float)(local_d0 / iVar2 + 0x80) / 255.0) * 256.0 + 128.0) - 128.0,
                           uVar6,uVar7,0x3f99999a);
              local_44 = local_d0 / iVar2;
            }
          }
          uVar7 = 0x43a00000;
          uVar6 = al_map_rgba(0,0xff,0,0x80);
          in_XMM1_Qa = 0x437b0000;
          al_draw_filled_rectangle
                    (((float)local_b8 / 127.0) * 320.0,0x437b0000,0,0x43800000,uVar6,uVar7);
          al_flip_display();
        }
        if (local_98[0] != 0x201) break;
        if ((local_38 != 0) && (lVar9 = al_get_audio_stream_fragment(local_20), lVar9 != 0)) {
          local_108 = 0;
          do {
            lVar8 = al_fread(local_38,lVar9 + local_108,0x1000 - local_108);
            local_110 = lVar8 + local_108;
            bVar11 = false;
            if (local_110 < 0x1000) {
              uVar3 = al_feof(local_38);
              bVar11 = false;
              if ((uVar3 & 1) == 0) {
                iVar4 = al_ferror(local_38);
                bVar11 = iVar4 == 0;
              }
            }
            local_108 = local_110;
          } while (bVar11);
          for (; local_110 < 0x1000; local_110 = local_110 + 1) {
            *(undefined1 *)(lVar9 + local_110) = 0x80;
          }
          al_set_audio_stream_fragment(local_20,lVar9);
          iVar4 = al_ferror(local_38);
          if ((iVar4 != 0) || (uVar5 = al_feof(local_38), (uVar5 & 1) != 0)) {
            al_drain_audio_stream(local_20);
            al_fclose(local_38);
            local_38 = 0;
          }
        }
      }
      if (local_98[0] == 0x2a) goto LAB_00102f75;
    } while (local_98[0] != 0xb);
    if (local_74 == 0x1b) break;
    if (local_74 == 0x20) {
      if (bVar1) {
        bVar1 = false;
        if (local_38 != 0) {
          al_fclose(local_38);
          local_38 = 0;
        }
      }
      else {
        bVar1 = true;
        uVar5 = al_get_audio_stream_playing(local_20);
        if ((uVar5 & 1) != 0) {
          al_drain_audio_stream(local_20);
        }
        if (local_40 == 0) {
          local_38 = al_make_temp_file("alrecXXX.raw",&local_40);
        }
        else {
          if (local_38 != 0) {
            al_fclose(local_38);
          }
          uVar6 = al_path_cstr(local_40,0x2f);
          local_38 = al_fopen(uVar6,"w");
        }
        local_4c = 0;
      }
    }
    else if (((local_74 == 0x70) && (!bVar1)) && (local_40 != 0)) {
      uVar6 = al_path_cstr(local_40,0x2f);
      local_38 = al_fopen(uVar6,"r");
      if (local_38 != 0) {
        al_set_audio_stream_playing(local_20,1);
      }
    }
  }
LAB_00102f75:
  al_destroy_audio_recorder(local_18);
  al_destroy_audio_stream(local_20);
  if (local_38 != 0) {
    al_fclose(local_38);
  }
  if (local_40 != 0) {
    uVar6 = al_path_cstr(local_40,0x2f);
    al_remove_filename(uVar6);
    al_destroy_path(local_40);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_AUDIO_RECORDER *r;
   ALLEGRO_AUDIO_STREAM *s;
   
   ALLEGRO_EVENT_QUEUE *q;
   ALLEGRO_DISPLAY *d;
   ALLEGRO_FILE *fp = NULL;
   ALLEGRO_PATH *tmp_path = NULL;
      
   int prev = 0;
   bool is_recording = false;
   
   int n = 0; /* number of samples written to disk */
   
   (void) argc;
   (void) argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }
   
   if (!al_init_primitives_addon()) {
      abort_example("Unable to initialize primitives addon");
   }
      
   if (!al_install_keyboard()) {
      abort_example("Unable to install keyboard");
   }
      
   if (!al_install_audio()) {
      abort_example("Unable to initialize audio addon");
   }
   
   if (!al_init_acodec_addon()) {
      abort_example("Unable to initialize acodec addon");
   }
   
   /* Note: increasing the number of channels will break this demo. Other
    * settings can be changed by modifying the constants at the top of the
    * file.
    */
   r = al_create_audio_recorder(1000, samples_per_fragment, frequency,
      audio_depth, ALLEGRO_CHANNEL_CONF_1);
   if (!r) {
      abort_example("Unable to create audio recorder");
   }
   
   s = al_create_audio_stream(playback_fragment_count,
      playback_samples_per_fragment, frequency, audio_depth,
      ALLEGRO_CHANNEL_CONF_1);      
   if (!s) {
      abort_example("Unable to create audio stream");
   }
      
   al_reserve_samples(0);
   al_set_audio_stream_playing(s, false);
   al_attach_audio_stream_to_mixer(s, al_get_default_mixer());
      
   q = al_create_event_queue();
   
   /* Note: the following two options are referring to pixel samples, and have
    * nothing to do with audio samples. */
   al_set_new_display_option(ALLEGRO_SAMPLE_BUFFERS, 1, ALLEGRO_SUGGEST);
   al_set_new_display_option(ALLEGRO_SAMPLES, 8, ALLEGRO_SUGGEST);
   
   d = al_create_display(320, 256);
   if (!d) {
      abort_example("Error creating display\n");
   }
      
   al_set_window_title(d, "SPACE to record. P to playback.");
   
   al_register_event_source(q, al_get_audio_recorder_event_source(r));
   al_register_event_source(q, al_get_audio_stream_event_source(s));
   al_register_event_source(q, al_get_display_event_source(d));
   al_register_event_source(q, al_get_keyboard_event_source());
   
   al_start_audio_recorder(r);
   
   while (true) {
      ALLEGRO_EVENT e;

      al_wait_for_event(q, &e);
       
      if (e.type == ALLEGRO_EVENT_AUDIO_RECORDER_FRAGMENT) {
         /* We received an incoming fragment from the microphone. In this
          * example, the recorder is constantly recording even when we aren't
          * saving to disk. The display is updated every time a new fragment
          * comes in, because it makes things more simple. If the fragments
          * are coming in faster than we can update the screen, then it will be
          * a problem.
          */          
         ALLEGRO_AUDIO_RECORDER_EVENT *re = al_get_audio_recorder_event(&e);
         audio_buffer_t input = (audio_buffer_t) re->buffer;
         int sample_count = re->samples; 
         const int R = sample_count / 320;
         int i, gain = 0;
         
         /* Calculate the volume, and display it regardless if we are actively
          * recording to disk. */
         for (i = 0; i < sample_count; ++i) {
            if (gain < abs(input[i] - sample_center))
               gain = abs(input[i] - sample_center);
         }
        
         al_clear_to_color(al_map_rgb(0,0,0));
        
         if (is_recording) {
            /* Save raw bytes to disk. Assumes everything is written
             * succesfully. */
            if (fp && n < frequency / (float) samples_per_fragment * 
               max_seconds_to_record) {
               al_fwrite(fp, input, sample_count * sample_size);
               ++n;
            }

            /* Draw a pathetic visualization. It draws exactly one fragment
             * per frame. This means the visualization is dependent on the 
             * various parameters. A more thorough implementation would use this
             * event to copy the new data into a circular buffer that holds a
             * few seconds of audio. The graphics routine could then always
             * draw that last second of audio, which would cause the
             * visualization to appear constant across all different settings.
             */
            for (i = 0; i < 320; ++i) {
               int j, c = 0;
               
               /* Take the average of R samples so it fits on the screen */
               for (j = i * R; j < i * R + R && j < sample_count; ++j) {
                  c += input[j] - sample_center;
               }
               c /= R;
               
               /* Draws a line from the previous sample point to the next */
               al_draw_line(i - 1, 128 + ((prev - min_sample_val) /
                  (float) sample_range) * 256 - 128, i, 128 +
                  ((c - min_sample_val) / (float) sample_range) * 256 - 128,
                  al_map_rgb(255,255,255), 1.2);
               
               prev = c;
            }
         }
         
         /* draw volume bar */
         al_draw_filled_rectangle((gain / (float) max_sample_val) * 320, 251,
            0, 256, al_map_rgba(0, 255, 0, 128));
            
         al_flip_display();
      }
      else if (e.type == ALLEGRO_EVENT_AUDIO_STREAM_FRAGMENT) {
         /* This event is received when we are playing back the audio clip.
          * See ex_saw.c for an example dedicated to playing streams.
          */
         if (fp) {
            audio_buffer_t output = al_get_audio_stream_fragment(s);
            if (output) {
               /* Fill the buffer from the data we have recorded into the file.
                * If an error occurs (or end of file) then silence out the
                * remainder of the buffer and stop the playback.
                */
               const size_t bytes_to_read =
                  playback_samples_per_fragment * sample_size;
               size_t bytes_read = 0, i;
               
               do {
                  bytes_read += al_fread(fp, (uint8_t *)output + bytes_read,
                     bytes_to_read - bytes_read);                  
               } while (bytes_read < bytes_to_read && !al_feof(fp) &&
                  !al_ferror(fp));
               
               /* silence out unused part of buffer (end of file) */
               for (i = bytes_read / sample_size;
                  i < bytes_to_read / sample_size; ++i) {
                     output[i] = sample_center;
               }
               
               al_set_audio_stream_fragment(s, output);
               
               if (al_ferror(fp) || al_feof(fp)) {
                  al_drain_audio_stream(s);
                  al_fclose(fp);
                  fp = NULL;
               }
            }
         }
      }      
      else if (e.type == ALLEGRO_EVENT_DISPLAY_CLOSE) {
         break;
      }
      else if (e.type == ALLEGRO_EVENT_KEY_CHAR) {
         if (e.keyboard.unichar == 27) {
            /* pressed ESC */
            break;
         }
         else if (e.keyboard.unichar == ' ') {
            if (!is_recording) {
               /* Start the recording */
               is_recording = true;
               
               if (al_get_audio_stream_playing(s)) {
                  al_drain_audio_stream(s);
               }
               
               /* Reuse the same temp file for all recordings */
               if (!tmp_path) {
                  fp = al_make_temp_file("alrecXXX.raw", &tmp_path);
               }
               else {
                  if (fp) al_fclose(fp);
                  fp = al_fopen(al_path_cstr(tmp_path, '/'), "w");
               }
               
               n = 0;
            }
            else {
               is_recording = false;
               if (fp) {
                  al_fclose(fp);
                  fp = NULL;
               }
            }
         }
         else if (e.keyboard.unichar == 'p') {
            /* Play the previously recorded wav file */
            if (!is_recording) {
               if (tmp_path) {
                  fp = al_fopen(al_path_cstr(tmp_path, '/'), "r");
                  if (fp) {
                     al_set_audio_stream_playing(s, true);
                  }
               }
            }
         }
      }
   }
   
   /* clean up */
   al_destroy_audio_recorder(r);
   al_destroy_audio_stream(s);
      
   if (fp)
      al_fclose(fp);
      
   if (tmp_path) {
      al_remove_filename(al_path_cstr(tmp_path, '/'));
      al_destroy_path(tmp_path);
   }
   
   return 0;
}